

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O0

uint32_t __thiscall
ixy::IxgbeDevice::tx_batch
          (IxgbeDevice *this,uint16_t queue_id,
          deque<ixy::Packet,_std::allocator<ixy::Packet>_> *buffer)

{
  uint16_t uVar1;
  bool bVar2;
  uint16_t uVar3;
  reference queue_00;
  reference pvVar4;
  ixgbe_adv_tx_desc *piVar5;
  uint64_t uVar6;
  ixgbe_adv_tx_desc *txd;
  uint16_t next_index;
  value_type *p;
  uint16_t clean_index;
  uint16_t cur_index;
  ixgbe_tx_queue *queue;
  int sent_packets;
  deque<ixy::Packet,_std::allocator<ixy::Packet>_> *buffer_local;
  uint16_t queue_id_local;
  IxgbeDevice *this_local;
  
  queue._4_4_ = 0;
  queue_00 = std::vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>::at
                       (&this->tx_queues,(ulong)queue_id);
  clean_tx_queue(queue_00);
  p._6_2_ = queue_00->tx_index;
  uVar1 = queue_00->clean_index;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&queue_00->mempool);
  if ((!bVar2) &&
     (bVar2 = std::deque<ixy::Packet,_std::allocator<ixy::Packet>_>::empty(buffer), !bVar2)) {
    pvVar4 = std::deque<ixy::Packet,_std::allocator<ixy::Packet>_>::front(buffer);
    std::shared_ptr<ixy::Mempool>::operator=(&queue_00->mempool,&pvVar4->pool);
  }
  while (bVar2 = std::deque<ixy::Packet,_std::allocator<ixy::Packet>_>::empty(buffer),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar4 = std::deque<ixy::Packet,_std::allocator<ixy::Packet>_>::front(buffer);
    p._6_2_ = wrap_ring(p._6_2_,queue_00->num_entries);
    if (uVar1 == p._6_2_) break;
    piVar5 = queue_00->descriptors + (int)(uint)queue_00->tx_index;
    uVar6 = Packet::get_phys_addr(pvVar4);
    (piVar5->read).buffer_addr = uVar6;
    uVar6 = Packet::size(pvVar4);
    *(uint *)((long)piVar5 + 8) = (uint)uVar6 | 0x2b300000;
    uVar6 = Packet::size(pvVar4);
    (piVar5->read).olinfo_status = (u32)(uVar6 << 0xe);
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&queue_00->bufs_in_use,&pvVar4->pool_entry);
    std::__shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(pvVar4->pool).super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>);
    uVar3 = wrap_ring(queue_00->tx_index,queue_00->num_entries);
    queue_00->tx_index = uVar3;
    std::deque<ixy::Packet,_std::allocator<ixy::Packet>_>::pop_front(buffer);
    queue._4_4_ = queue._4_4_ + 1;
  }
  set_reg32(this,(long)(int)((uint)queue_id * 0x40 + 0x6018),(uint)queue_00->tx_index);
  return queue._4_4_;
}

Assistant:

auto IxgbeDevice::tx_batch(uint16_t queue_id, std::deque<Packet> &buffer) -> uint32_t {
    auto sent_packets = 0;

    struct ixgbe_tx_queue *queue = &tx_queues.at(queue_id);

    clean_tx_queue(queue);

    auto cur_index = queue->tx_index;
    auto clean_index = queue->clean_index;

    if (!queue->mempool && !buffer.empty()) {
        queue->mempool = buffer.front().pool;
    }

    while (!buffer.empty()) {
        auto &p = buffer.front();

        auto next_index = wrap_ring(cur_index, queue->num_entries);

        if (clean_index == next_index) {
            // tx queue of device is full
            break;
        }

        volatile union ixgbe_adv_tx_desc *txd = queue->descriptors + queue->tx_index;
        // NIC reads from here
        txd->read.buffer_addr = p.get_phys_addr();
        // always the same flags: one buffer (EOP), advanced data descriptor, CRC offload, data length
        txd->read.cmd_type_len =
                static_cast<u32>(IXGBE_ADVTXD_DCMD_EOP | IXGBE_ADVTXD_DCMD_RS | IXGBE_ADVTXD_DCMD_IFCS |
                                 IXGBE_ADVTXD_DCMD_DEXT |
                                 IXGBE_ADVTXD_DTYP_DATA | p.size());
        // no fancy offloading stuff - only the total payload length
        // implement offloading flags here:
        // 	* ip checksum offloading is trivial: just set the offset
        // 	* tcp/udp checksum offloading is more annoying, you have to precalculate the pseudo-header checksum
        txd->read.olinfo_status = static_cast<u32>(p.size() << IXGBE_ADVTXD_PAYLEN_SHIFT);

        queue->bufs_in_use.push_back(p.pool_entry);

        p.pool.reset();

        queue->tx_index = wrap_ring(queue->tx_index, queue->num_entries);

        buffer.pop_front();

        cur_index = next_index;
        sent_packets += 1;
    }

    set_reg32(IXGBE_TDT(queue_id), queue->tx_index);

    return sent_packets;
}